

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

Model * readinstance(Model *__return_storage_ptr__,string *filename)

{
  size_t in_RCX;
  void *__buf;
  Reader reader;
  string sStack_4e8;
  Reader local_4c8;
  
  std::__cxx11::string::string((string *)&sStack_4e8,(string *)filename);
  Reader::Reader(&local_4c8,&sStack_4e8);
  std::__cxx11::string::~string((string *)&sStack_4e8);
  Reader::read((Reader *)__return_storage_ptr__,(int)&local_4c8,__buf,in_RCX);
  Reader::~Reader(&local_4c8);
  return __return_storage_ptr__;
}

Assistant:

Model readinstance(std::string filename) {
  Reader reader(filename);
  return reader.read();
}